

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall FBX::Parser::~Parser(Parser *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->processes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->processes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  std::
  _Rb_tree<FBX::Process_*,_FBX::Process_*,_std::_Identity<FBX::Process_*>,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>
  ::~_Rb_tree(&(this->processes)._M_t);
  return;
}

Assistant:

Parser::~Parser() {
        for (auto &process : processes)
            delete process;
    }